

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O1

void sg_begin_pass(sg_pass pass_id,sg_pass_action *pass_action)

{
  uint32_t *puVar1;
  _sg_image_t *p_Var2;
  _sg_pass_t *pass;
  _sg_pass_attachment_common_t *p_Var3;
  long lVar4;
  sg_pass_action pa;
  sg_pass_action sStack_98;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                  ,0x3fc2,"void sg_begin_pass(sg_pass, const sg_pass_action *)");
  }
  if (pass_action == (sg_pass_action *)0x0) {
    __assert_fail("pass_action",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                  ,0x3fc3,"void sg_begin_pass(sg_pass, const sg_pass_action *)");
  }
  if ((pass_action->_start_canary != 0) || (pass_action->_end_canary != 0)) {
    __assert_fail("(pass_action->_start_canary == 0) && (pass_action->_end_canary == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                  ,0x3fc4,"void sg_begin_pass(sg_pass, const sg_pass_action *)");
  }
  _sg.cur_pass.id = pass_id.id;
  if (pass_id.id != 0) {
    pass = _sg_pass_at(&_sg.pools,pass_id.id);
    if ((pass->slot).id == pass_id.id) goto LAB_00114728;
  }
  pass = (_sg_pass_t *)0x0;
LAB_00114728:
  if (pass == (_sg_pass_t *)0x0) {
    _sg.pass_valid = false;
  }
  else {
    if (_sg.desc.disable_validation == false) {
      _sg.validate_error = _SG_VALIDATE_SUCCESS;
      if ((pass->slot).state != SG_RESOURCESTATE_VALID) {
        _sg.validate_error = _SG_VALIDATE_BEGINPASS_PASS;
        if (_sg.desc.logger.log_cb == (_func_void_char_ptr_void_ptr *)0x0) {
          puts("sg_begin_pass: pass must be valid");
        }
        else {
          (*_sg.desc.logger.log_cb)("sg_begin_pass: pass must be valid",_sg.desc.logger.user_data);
        }
      }
      p_Var3 = (pass->cmn).color_atts;
      lVar4 = 0;
      do {
        puVar1 = *(uint32_t **)((long)&(pass->gl).color_atts[0].image + lVar4);
        if (puVar1 != (uint32_t *)0x0) {
          if (puVar1[2] != 2) {
            _sg.validate_error = _SG_VALIDATE_BEGINPASS_IMAGE;
            if (_sg.desc.logger.log_cb == (_func_void_char_ptr_void_ptr *)0x0) {
              puts("sg_begin_pass: one or more attachment images are not valid");
            }
            else {
              (*_sg.desc.logger.log_cb)
                        ("sg_begin_pass: one or more attachment images are not valid",
                         _sg.desc.logger.user_data);
            }
          }
          if (*puVar1 != (p_Var3->image_id).id) {
            _sg.validate_error = _SG_VALIDATE_BEGINPASS_IMAGE;
            if (_sg.desc.logger.log_cb == (_func_void_char_ptr_void_ptr *)0x0) {
              puts("sg_begin_pass: one or more attachment images are not valid");
            }
            else {
              (*_sg.desc.logger.log_cb)
                        ("sg_begin_pass: one or more attachment images are not valid",
                         _sg.desc.logger.user_data);
            }
          }
        }
        lVar4 = lVar4 + 0x10;
        p_Var3 = p_Var3 + 1;
      } while (lVar4 != 0x40);
      p_Var2 = (pass->gl).ds_att.image;
      if (p_Var2 != (_sg_image_t *)0x0) {
        if ((p_Var2->slot).state != SG_RESOURCESTATE_VALID) {
          _sg.validate_error = _SG_VALIDATE_BEGINPASS_IMAGE;
          if (_sg.desc.logger.log_cb == (_func_void_char_ptr_void_ptr *)0x0) {
            puts("sg_begin_pass: one or more attachment images are not valid");
          }
          else {
            (*_sg.desc.logger.log_cb)
                      ("sg_begin_pass: one or more attachment images are not valid",
                       _sg.desc.logger.user_data);
          }
        }
        if ((p_Var2->slot).id != (pass->cmn).ds_att.image_id.id) {
          _sg.validate_error = _SG_VALIDATE_BEGINPASS_IMAGE;
          if (_sg.desc.logger.log_cb == (_func_void_char_ptr_void_ptr *)0x0) {
            puts("sg_begin_pass: one or more attachment images are not valid");
          }
          else {
            (*_sg.desc.logger.log_cb)
                      ("sg_begin_pass: one or more attachment images are not valid",
                       _sg.desc.logger.user_data);
          }
        }
      }
      _sg_validate_end();
    }
    _sg.pass_valid = true;
    _sg_resolve_default_pass_action(pass_action,&sStack_98);
    p_Var2 = (pass->gl).color_atts[0].image;
    if (p_Var2 == (_sg_image_t *)0x0) {
      __assert_fail("img",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/sokol-src/sokol_gfx.h"
                    ,0x3fcc,"void sg_begin_pass(sg_pass, const sg_pass_action *)");
    }
    _sg_begin_pass(pass,&sStack_98,(p_Var2->cmn).width,(p_Var2->cmn).height);
  }
  return;
}

Assistant:

_SOKOL_PRIVATE void _sg_gl_begin_pass(_sg_pass_t* pass, const sg_pass_action* action, int w, int h) {
    /* FIXME: what if a texture used as render target is still bound, should we
       unbind all currently bound textures in begin pass? */
    SOKOL_ASSERT(action);
    SOKOL_ASSERT(!_sg.gl.in_pass);
    _SG_GL_CHECK_ERROR();
    _sg.gl.in_pass = true;
    _sg.gl.cur_pass = pass; /* can be 0 */
    if (pass) {
        _sg.gl.cur_pass_id.id = pass->slot.id;
    }
    else {
        _sg.gl.cur_pass_id.id = SG_INVALID_ID;
    }
    _sg.gl.cur_pass_width = w;
    _sg.gl.cur_pass_height = h;

    /* number of color attachments */
    const int num_color_atts = pass ? pass->cmn.num_color_atts : 1;

    /* bind the render pass framebuffer */
    if (pass) {
        /* offscreen pass */
        SOKOL_ASSERT(pass->gl.fb);
        glBindFramebuffer(GL_FRAMEBUFFER, pass->gl.fb);
    }
    else {
        /* default pass */
        SOKOL_ASSERT(_sg.gl.cur_context);
        glBindFramebuffer(GL_FRAMEBUFFER, _sg.gl.cur_context->default_framebuffer);
    }
    glViewport(0, 0, w, h);
    glScissor(0, 0, w, h);

    /* clear color and depth-stencil attachments if needed */
    bool clear_color = false;
    for (int i = 0; i < num_color_atts; i++) {
        if (SG_ACTION_CLEAR == action->colors[i].action) {
            clear_color = true;
            break;
        }
    }
    const bool clear_depth = (action->depth.action == SG_ACTION_CLEAR);
    const bool clear_stencil = (action->stencil.action == SG_ACTION_CLEAR);

    bool need_pip_cache_flush = false;
    if (clear_color) {
        bool need_color_mask_flush = false;
        // NOTE: not a bug to iterate over all possible color attachments
        for (int i = 0; i < SG_MAX_COLOR_ATTACHMENTS; i++) {
            if (SG_COLORMASK_RGBA != _sg.gl.cache.color_write_mask[i]) {
                need_pip_cache_flush = true;
                need_color_mask_flush = true;
                _sg.gl.cache.color_write_mask[i] = SG_COLORMASK_RGBA;
            }
        }
        if (need_color_mask_flush) {
            glColorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
        }
    }
    if (clear_depth) {
        if (!_sg.gl.cache.depth.write_enabled) {
            need_pip_cache_flush = true;
            _sg.gl.cache.depth.write_enabled = true;
            glDepthMask(GL_TRUE);
        }
        if (_sg.gl.cache.depth.compare != SG_COMPAREFUNC_ALWAYS) {
            need_pip_cache_flush = true;
            _sg.gl.cache.depth.compare = SG_COMPAREFUNC_ALWAYS;
            glDepthFunc(GL_ALWAYS);
        }
    }
    if (clear_stencil) {
        if (_sg.gl.cache.stencil.write_mask != 0xFF) {
            need_pip_cache_flush = true;
            _sg.gl.cache.stencil.write_mask = 0xFF;
            glStencilMask(0xFF);
        }
    }
    if (need_pip_cache_flush) {
        /* we messed with the state cache directly, need to clear cached
           pipeline to force re-evaluation in next sg_apply_pipeline() */
        _sg.gl.cache.cur_pipeline = 0;
        _sg.gl.cache.cur_pipeline_id.id = SG_INVALID_ID;
    }
    bool use_mrt_clear = (0 != pass);
    #if defined(SOKOL_GLES2)
    use_mrt_clear = false;
    #else
    if (_sg.gl.gles2) {
        use_mrt_clear = false;
    }
    #endif
    if (!use_mrt_clear) {
        GLbitfield clear_mask = 0;
        if (clear_color) {
            clear_mask |= GL_COLOR_BUFFER_BIT;
            const sg_color c = action->colors[0].value;
            glClearColor(c.r, c.g, c.b, c.a);
        }
        if (clear_depth) {
            clear_mask |= GL_DEPTH_BUFFER_BIT;
            #ifdef SOKOL_GLCORE33
            glClearDepth(action->depth.value);
            #else
            glClearDepthf(action->depth.value);
            #endif
        }
        if (clear_stencil) {
            clear_mask |= GL_STENCIL_BUFFER_BIT;
            glClearStencil(action->stencil.value);
        }
        if (0 != clear_mask) {
            glClear(clear_mask);
        }
    }
    #if !defined SOKOL_GLES2
    else {
        SOKOL_ASSERT(pass);
        for (int i = 0; i < num_color_atts; i++) {
            if (action->colors[i].action == SG_ACTION_CLEAR) {
                glClearBufferfv(GL_COLOR, i, &action->colors[i].value.r);
            }
        }
        if (pass->gl.ds_att.image) {
            if (clear_depth && clear_stencil) {
                glClearBufferfi(GL_DEPTH_STENCIL, 0, action->depth.value, action->stencil.value);
            }
            else if (clear_depth) {
                glClearBufferfv(GL_DEPTH, 0, &action->depth.value);
            }
            else if (clear_stencil) {
                GLint val = (GLint) action->stencil.value;
                glClearBufferiv(GL_STENCIL, 0, &val);
            }
        }
    }
    #endif
    _SG_GL_CHECK_ERROR();
}